

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3DbIsNamed(sqlite3 *db,int iDb,char *zName)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    bVar1 = *(byte *)((long)&(&db->pVfs)[(long)iDb * 4]->iVersion + lVar3);
    if (bVar1 == zName[lVar3]) {
      if ((ulong)bVar1 == 0) {
        return 1;
      }
    }
    else if (""[bVar1] != ""[(byte)zName[lVar3]]) {
      if (iDb != 0) {
        return 0;
      }
      lVar3 = 0;
      break;
    }
    lVar3 = lVar3 + 1;
  } while( true );
LAB_0014ca25:
  bVar1 = "main"[lVar3];
  bVar2 = zName[lVar3];
  if (bVar1 == bVar2) {
    if ((ulong)bVar1 == 0) goto LAB_0014ca49;
  }
  else if (""[bVar1] != ""[bVar2]) {
LAB_0014ca49:
    return (int)(bVar1 == bVar2);
  }
  lVar3 = lVar3 + 1;
  goto LAB_0014ca25;
}

Assistant:

SQLITE_PRIVATE int sqlite3DbIsNamed(sqlite3 *db, int iDb, const char *zName){
  return (
      sqlite3StrICmp(db->aDb[iDb].zDbSName, zName)==0
   || (iDb==0 && sqlite3StrICmp("main", zName)==0)
  );
}